

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuilder.c
# Opt level: O1

strbuilder * strbuilder_append_string(strbuilder *builder,char *str)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  
  if (builder == (strbuilder *)0x0) {
LAB_0010f017:
    builder = (strbuilder *)0x0;
  }
  else if (*str != '\0') {
    pcVar3 = str + 1;
    do {
      if ((builder->position == builder->buffer_end) && (sVar2 = increase_size(builder), sVar2 == 0)
         ) goto LAB_0010f017;
      *builder->position = pcVar3[-1];
      builder->position = builder->position + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  return builder;
}

Assistant:

struct strbuilder *
strbuilder_append_string( struct strbuilder *builder, const char *str ) {
  const char *curr;
  size_t old_size;

  if( !builder ) {
    return NULL;
  }

  curr = str;
  while ( *curr != '\0' ) {
    if( builder->position == builder->buffer_end ) {
      old_size = increase_size( builder );
      if( old_size == 0 ) {
        return NULL;
      }
    }

    *( builder->position ) = *curr;
    builder->position++;

    curr++;
  }

  return builder;
}